

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcommonstyle.cpp
# Opt level: O2

QIcon __thiscall
QCommonStylePrivate::iconFromWindowsTheme
          (QCommonStylePrivate *this,StandardPixmap standardIcon,QStyleOption *option,
          QWidget *widget)

{
  *(undefined1 **)&this->super_QStylePrivate = &DAT_aaaaaaaaaaaaaaaa;
  QIcon::QIcon((QIcon *)this);
  return (QIcon)(QIconPrivate *)this;
}

Assistant:

QIcon QCommonStylePrivate::iconFromWindowsTheme(QCommonStyle::StandardPixmap standardIcon,
                                                const QStyleOption *option,
                                                const QWidget *widget) const
{
    Q_UNUSED(option);
    Q_UNUSED(widget);
    QIcon icon;
#ifdef Q_OS_WIN
    switch (standardIcon) {
    case QStyle::SP_DriveCDIcon:
    case QStyle::SP_DriveDVDIcon:
    case QStyle::SP_DriveNetIcon:
    case QStyle::SP_DriveHDIcon:
    case QStyle::SP_DriveFDIcon:
    case QStyle::SP_FileIcon:
    case QStyle::SP_FileLinkIcon:
    case QStyle::SP_DesktopIcon:
    case QStyle::SP_ComputerIcon:
    case QStyle::SP_VistaShield:
    case QStyle::SP_MessageBoxInformation:
    case QStyle::SP_MessageBoxWarning:
    case QStyle::SP_MessageBoxCritical:
    case QStyle::SP_MessageBoxQuestion:
        if (const QPlatformTheme *theme = QGuiApplicationPrivate::platformTheme()) {
            QPlatformTheme::StandardPixmap sp = static_cast<QPlatformTheme::StandardPixmap>(standardIcon);
            const auto dpr = QStyleHelper::getDpr(widget);
            const QList<QSize> sizes = theme->themeHint(QPlatformTheme::IconPixmapSizes).value<QList<QSize>>();
            for (const QSize &size : sizes) {
                QPixmap pixmap = theme->standardPixmap(sp, size * dpr);
                pixmap.setDevicePixelRatio(dpr);
                icon.addPixmap(pixmap, QIcon::Normal);
            }
        }
        break;
    case QStyle::SP_DirIcon:
    case QStyle::SP_DirLinkIcon:
        if (const QPlatformTheme *theme = QGuiApplicationPrivate::platformTheme()) {
            QPlatformTheme::StandardPixmap spOff = static_cast<QPlatformTheme::StandardPixmap>(standardIcon);
            QPlatformTheme::StandardPixmap spOn = standardIcon == QStyle::SP_DirIcon ? QPlatformTheme::DirOpenIcon
                                                                                     : QPlatformTheme::DirLinkOpenIcon;
            const auto dpr = QStyleHelper::getDpr(widget);
            const QList<QSize> sizes = theme->themeHint(QPlatformTheme::IconPixmapSizes).value<QList<QSize>>();
            for (const QSize &size : sizes) {
                const QSizeF pixSize = size * dpr;
                QPixmap pixmap = theme->standardPixmap(spOff, pixSize);
                pixmap.setDevicePixelRatio(dpr);
                icon.addPixmap(pixmap, QIcon::Normal, QIcon::Off);
                pixmap = theme->standardPixmap(spOn, pixSize);
                pixmap.setDevicePixelRatio(dpr);
                icon.addPixmap(pixmap, QIcon::Normal, QIcon::On);
            }
        }
        break;
    default:
        break;
    }
#else
    Q_UNUSED(standardIcon)
#endif
    return icon;
}